

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall DPlayerMenu::ClassChanged(DPlayerMenu *this,FListMenuItem *li)

{
  undefined8 *puVar1;
  int iVar2;
  FListMenuItem *pFVar3;
  undefined8 *puVar4;
  char *val;
  int sel;
  undefined8 local_28;
  
  if (PlayerClasses.Count != 1) {
    local_28 = &PlayerClasses;
    iVar2 = (*li->_vptr_FListMenuItem[0xb])(li,0,&local_28);
    if ((char)iVar2 != '\0') {
      userinfo_t::PlayerClassNumChanged
                ((userinfo_t *)(&DAT_00a392c8 + (long)consoleplayer * 0x54),
                 (int)local_28 - (gameinfo.norandomplayerclass ^ 1));
      PickPlayerClass(this);
      if (((int)local_28 == 0) && (gameinfo.norandomplayerclass != true)) {
        val = "Random";
      }
      else {
        val = (this->PlayerClass->Type->DisplayName).Chars;
      }
      cvar_set("playerclass",val);
      UpdateSkins(this);
      UpdateColorsets(this);
      UpdateTranslation(this);
      local_28 = (TArray<FPlayerClass,_FPlayerClass> *)CONCAT44(0x1ee,(int)local_28);
      pFVar3 = DListMenu::GetItem(&this->super_DListMenu,(FName *)((long)&local_28 + 4));
      if (pFVar3 != (FListMenuItem *)0x0) {
        puVar1 = (undefined8 *)
                 ((ulong)(((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x21d) * 0x18) +
                 (&DAT_00a392c8)[(long)consoleplayer * 0x54]);
        do {
          puVar4 = puVar1;
          puVar1 = (undefined8 *)*puVar4;
        } while (*(int *)(puVar4 + 1) != 0x21d);
        (*pFVar3->_vptr_FListMenuItem[10])(pFVar3,0x10003,(ulong)*(uint *)(puVar4[2] + 0x28));
      }
    }
  }
  return;
}

Assistant:

unsigned int Size () const
	{
		return Count;
	}